

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_SetTxOutCommitmentTest_Test::TestBody
          (ConfidentialTransaction_SetTxOutCommitmentTest_Test *this)

{
  uint uVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined1 extraout_DL;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  uint32_t index;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_1;
  ConfidentialNonce nonce;
  AssertionResult gtest_ar_2;
  ConfidentialAssetId asset;
  ByteData surjection_proof;
  ByteData range_proof;
  ConfidentialTransaction tx;
  ConfidentialTxOutReference txout_ref;
  AssertHelper local_350 [2];
  undefined1 local_340 [20];
  uint local_32c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_320;
  long local_318 [3];
  internal local_300 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  ConfidentialNonce local_2f0;
  undefined1 local_2c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  undefined1 local_2b8 [64];
  ConfidentialAssetId local_278;
  ConfidentialValue local_250;
  ConfidentialNonce CStack_228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_1e8;
  undefined1 local_1d0 [64];
  ConfidentialAssetId local_190;
  Txid local_168 [2];
  undefined1 local_128 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_118;
  Script local_110;
  ConfidentialAssetId local_d8;
  ConfidentialValue local_b0;
  ConfidentialNonce local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_168,(string *)&exp_tx_empty_hex_abi_cxx11_);
  local_32c = 0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_32c = cfd::core::ConfidentialTransaction::AddTxIn
                            (local_168,0x4e9ee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ff,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if (CONCAT71(local_128._1_7_,local_128[0]) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)CONCAT71(local_128._1_7_,local_128[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_128._1_7_,local_128[0]) + 8))();
      }
    }
  }
  local_2c8._0_4_ = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_1d0._0_8_ = (ulong)(uint)local_1d0._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_128,"tx.GetTxOutCount()","0",(uint *)local_2c8,(int *)local_1d0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (local_120.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_120.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x302,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190._vptr_ConfidentialAssetId =
       (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = extraout_DL;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1d0,(string *)&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_128);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_32c = cfd::core::ConfidentialTransaction::AddTxOut
                            ((Amount *)local_168,&local_190,(Script *)local_1d0);
    }
  }
  else {
    testing::Message::Message((Message *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x308,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2c8 + 8))();
      }
    }
  }
  local_2f0._vptr_ConfidentialNonce =
       (_func_int **)((ulong)local_2f0._vptr_ConfidentialNonce._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2c8,"index","0",&local_32c,(int *)&local_2f0);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x309,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2f0._vptr_ConfidentialNonce != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2f0._vptr_ConfidentialNonce != (_func_int **)0x0)) {
        (**(code **)(*local_2f0._vptr_ConfidentialNonce + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_2f0._vptr_ConfidentialNonce =
       (_func_int **)CONCAT44(local_2f0._vptr_ConfidentialNonce._4_4_,uVar4);
  local_350[0].data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2c8,"tx.GetTxOutCount()","1",(uint *)&local_2f0,(int *)local_350);
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_2c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x30a,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2f0._vptr_ConfidentialNonce != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2f0._vptr_ConfidentialNonce != (_func_int **)0x0)) {
        (**(code **)(*local_2f0._vptr_ConfidentialNonce + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)local_2c8);
      local_118 = local_2b8[0];
      local_120.ptr_ = local_2c0.ptr_;
      cfd::core::Script::operator=(&local_110,(Script *)(local_2b8 + 8));
      cfd::core::ConfidentialAssetId::operator=(&local_d8,&local_278);
      cfd::core::ConfidentialValue::operator=(&local_b0,&local_250);
      cfd::core::ConfidentialNonce::operator=(&local_88,&CStack_228);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_60,&vStack_200);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_48,&vStack_1e8);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_2c8);
    }
  }
  else {
    testing::Message::Message((Message *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x30b,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2c8 + 8))();
      }
    }
  }
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,"991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             "");
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_2f0,(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8);
  }
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"1234567890","");
  cfd::core::ByteData::ByteData((ByteData *)(local_1d0 + 0x28),(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8);
  }
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,"1234567890123456789012345678901234567890","");
  cfd::core::ByteData::ByteData
            ((ByteData *)
             ((long)&local_190.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8),(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    uVar1 = local_32c;
    if (bVar3) {
      cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_2c8,&local_b0);
      cfd::core::ConfidentialTransaction::SetTxOutCommitment
                ((uint)local_168,(ConfidentialAssetId *)(ulong)uVar1,(ConfidentialValue *)local_1d0,
                 (ConfidentialNonce *)local_2c8,(ByteData *)&local_2f0,
                 (ByteData *)(local_1d0 + 0x28));
      local_2c8 = (undefined1  [8])&PTR__ConfidentialValue_004e0f10;
      if (local_2c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        operator_delete(local_2c0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x314,
               "Expected: (tx.SetTxOutCommitment(index, asset, txout_ref.GetConfidentialValue(), nonce, surjection_proof, range_proof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)local_2c8);
      local_118 = local_2b8[0];
      local_120.ptr_ = local_2c0.ptr_;
      cfd::core::Script::operator=(&local_110,(Script *)(local_2b8 + 8));
      cfd::core::ConfidentialAssetId::operator=(&local_d8,&local_278);
      cfd::core::ConfidentialValue::operator=(&local_b0,&local_250);
      cfd::core::ConfidentialNonce::operator=(&local_88,&CStack_228);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_60,&vStack_200);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_48,&vStack_1e8);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_2c8);
    }
  }
  else {
    testing::Message::Message((Message *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x315,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_2c8,&local_d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_328,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_),
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  local_2c8 = (undefined1  [8])&PTR__ConfidentialAssetId_004e1078;
  if (local_2c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_2c0.ptr_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (sStack_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x318,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_2c8,&local_b0);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_328,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",
             (char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_),
             "010000000000bc614e");
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  local_2c8 = (undefined1  [8])&PTR__ConfidentialValue_004e0f10;
  if (local_2c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_2c0.ptr_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (sStack_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x31a,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_2c8,&local_110);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar7 = (char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_300,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",pcVar7,(char *)local_328);
  if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318) {
    operator_delete(local_328);
  }
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  cfd::core::Script::~Script((Script *)local_2c8);
  if (local_300[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (local_2f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2f8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x31c,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_2c8,&local_88);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_328,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_),
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  local_2c8 = (undefined1  [8])&PTR__ConfidentialNonce_004e1260;
  if (local_2c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_2c0.ptr_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (sStack_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,799,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sStack_320.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = 0;
  uVar6 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar6);
    sVar8 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
  }
  local_318[0] = uVar6 + (long)pbVar5;
  local_328 = pbVar5;
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_320.ptr_ = pbVar5;
    memmove(pbVar5,local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar8);
  }
  sStack_320.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  auVar2 = local_2c8;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_300,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",(char *)auVar2,
             (char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8);
  }
  if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_328);
  }
  if (local_300[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (local_2f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2f8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x321,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sStack_320.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318[0] = 0;
  uVar6 = (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar6);
    sVar8 = (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
  }
  local_318[0] = uVar6 + (long)pbVar5;
  local_328 = pbVar5;
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_320.ptr_ = pbVar5;
    memmove(pbVar5,local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar8);
  }
  sStack_320.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  auVar2 = local_2c8;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_300,"txout_ref.GetRangeProof().GetHex().c_str()","range_proof.GetHex().c_str()",
             (char *)auVar2,(char *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  if ((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_) != local_340) {
    operator_delete((undefined1 *)CONCAT44(local_350[0].data_._4_4_,local_350[0].data_._0_4_));
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8);
  }
  if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_328);
  }
  if (local_300[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (local_2f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2f8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x323,pcVar7);
    testing::internal::AssertHelper::operator=(local_350,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    if (local_2c8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_2c8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_190.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1d0._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._40_8_);
  }
  local_2f0._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_004e1260;
  if (local_2f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_128);
  local_1d0._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((pointer)local_1d0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._8_8_);
  }
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_168)
  ;
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetTxOutCommitmentTest) {
  ConfidentialTransaction tx(exp_tx_empty_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));

  // AddTxOut, GetTxOut, GetTxOutCount
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  int64_t exp_satoshi = 12345678;

  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  ConfidentialTxOutReference txout_ref;
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));

  // SetTxOutCommitment
  ConfidentialNonce nonce(
      "991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  ByteData surjection_proof("1234567890");
  ByteData range_proof("1234567890123456789012345678901234567890");
  EXPECT_NO_THROW(
      (tx.SetTxOutCommitment(index, asset, txout_ref.GetConfidentialValue(),
                             nonce, surjection_proof, range_proof)));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());
}